

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int anon_unknown.dwarf_354e9::HandleCppLint
              (string *runCmd,string *sourceFile,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *param_3)

{
  bool bVar1;
  container_type *command;
  ostream *poVar2;
  reference pvVar3;
  ulong uVar4;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  int local_74;
  undefined1 local_70 [4];
  int ret;
  string stdOut;
  undefined1 local_40 [8];
  cmList cpplint_cmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_2_local;
  string *sourceFile_local;
  string *runCmd_local;
  
  cpplint_cmd.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)param_3;
  cmList::cmList((cmList *)local_40,runCmd,Yes);
  cmList::push_back((cmList *)local_40,sourceFile);
  std::__cxx11::string::string((string *)local_70);
  command = cmList::operator_cast_to_vector_((cmList *)local_40);
  timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = cmSystemTools::RunSingleCommand
                    (command,(string *)local_70,(string *)local_70,&local_74,(char *)0x0,OUTPUT_NONE
                     ,(cmDuration)timeout.__r,Auto);
  if (bVar1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"Warning: cpplint diagnostics:\n");
      std::operator<<((ostream *)&std::cerr,(string *)local_70);
    }
    runCmd_local._4_4_ = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error running \'");
    pvVar3 = cmList::operator[][abi_cxx11_((cmList *)local_40,0);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    poVar2 = std::operator<<(poVar2,"\': ");
    poVar2 = std::operator<<(poVar2,(string *)local_70);
    std::operator<<(poVar2,"\n");
    runCmd_local._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_70);
  cmList::~cmList((cmList *)local_40);
  return runCmd_local._4_4_;
}

Assistant:

int HandleCppLint(const std::string& runCmd, const std::string& sourceFile,
                  const std::vector<std::string>&)
{
  // Construct the cpplint command line.
  cmList cpplint_cmd{ runCmd, cmList::EmptyElements::Yes };
  cpplint_cmd.push_back(sourceFile);

  // Run the cpplint command line.  Capture its output.
  std::string stdOut;
  int ret;
  if (!cmSystemTools::RunSingleCommand(cpplint_cmd, &stdOut, &stdOut, &ret,
                                       nullptr, cmSystemTools::OUTPUT_NONE)) {
    std::cerr << "Error running '" << cpplint_cmd[0] << "': " << stdOut
              << "\n";
    return 1;
  }
  if (!stdOut.empty()) {
    std::cerr << "Warning: cpplint diagnostics:\n";
    // Output the output from cpplint to stderr
    std::cerr << stdOut;
  }

  // always return 0 so the build can continue as cpplint returns non-zero
  // for any warning
  return 0;
}